

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

void HashmapNodeLink(jx9_hashmap *pMap,jx9_hashmap_node *pNode,sxu32 nBucketIdx)

{
  jx9_hashmap_node *pjVar1;
  jx9_hashmap_node **ppjVar2;
  
  ppjVar2 = pMap->apBucket;
  if (ppjVar2[nBucketIdx] != (jx9_hashmap_node *)0x0) {
    pNode->pNextCollide = ppjVar2[nBucketIdx];
    ppjVar2[nBucketIdx]->pPrevCollide = pNode;
  }
  ppjVar2[nBucketIdx] = pNode;
  if (pMap->pFirst == (jx9_hashmap_node *)0x0) {
    pMap->pLast = pNode;
    pMap->pFirst = pNode;
    ppjVar2 = &pMap->pCur;
  }
  else {
    ppjVar2 = &pMap->pLast;
    pjVar1 = *ppjVar2;
    if (pjVar1 != (jx9_hashmap_node *)0x0) {
      pNode->pNext = pjVar1;
      pjVar1->pPrev = pNode;
    }
  }
  *ppjVar2 = pNode;
  pMap->nEntry = pMap->nEntry + 1;
  return;
}

Assistant:

static void HashmapNodeLink(jx9_hashmap *pMap, jx9_hashmap_node *pNode, sxu32 nBucketIdx)
{
	/* Link */
	if( pMap->apBucket[nBucketIdx] != 0 ){
		pNode->pNextCollide = pMap->apBucket[nBucketIdx];
		pMap->apBucket[nBucketIdx]->pPrevCollide = pNode;
	}
	pMap->apBucket[nBucketIdx] = pNode;
	/* Link to the map list */
	if( pMap->pFirst == 0 ){
		pMap->pFirst = pMap->pLast = pNode;
		/* Point to the first inserted node */
		pMap->pCur = pNode;
	}else{
		MACRO_LD_PUSH(pMap->pLast, pNode);
	}
	++pMap->nEntry;
}